

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O0

RecyclerTestObject * LeafObject<51U,_1000U>::New(void)

{
  Recycler *pRVar1;
  LeafObject<51U,_1000U> *this;
  TrackAllocData local_38;
  uint local_c;
  uint count;
  
  local_c = GetRandomInteger(0x3b6);
  pRVar1 = recyclerInstance;
  local_c = local_c + 0x33;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&LeafObject<51u,1000u>::typeinfo,(ulong)local_c << 3,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/RecyclerTestObject.h"
             ,0x91);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this = (LeafObject<51U,_1000U> *)new<Memory::Recycler>(0x18,pRVar1,0x21cb30,0);
  LeafObject(this,local_c);
  return &this->super_RecyclerTestObject;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewPlusLeaf(recyclerInstance, sizeof(size_t) * count, LeafObject, count);
    }